

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::CategoricalMapping::ByteSizeLong(CategoricalMapping *this)

{
  bool bVar1;
  MappingTypeCase MVar2;
  ValueOnUnknownCase VVar3;
  int size;
  string *value;
  int64_t value_00;
  size_t sVar4;
  long lVar5;
  int cached_size;
  uint32_t cached_has_bits;
  size_t total_size;
  CategoricalMapping *this_local;
  
  _cached_size = 0;
  MVar2 = MappingType_case(this);
  if (MVar2 != MAPPINGTYPE_NOT_SET) {
    if (MVar2 == kStringToInt64Map) {
      _cached_size = google::protobuf::internal::WireFormatLite::
                     MessageSize<CoreML::Specification::StringToInt64Map>
                               ((this->MappingType_).stringtoint64map_);
      _cached_size = _cached_size + 1;
    }
    else if (MVar2 == kInt64ToStringMap) {
      _cached_size = google::protobuf::internal::WireFormatLite::
                     MessageSize<CoreML::Specification::Int64ToStringMap>
                               ((this->MappingType_).int64tostringmap_);
      _cached_size = _cached_size + 1;
    }
  }
  VVar3 = ValueOnUnknown_case(this);
  if (VVar3 != VALUEONUNKNOWN_NOT_SET) {
    if (VVar3 == kStrValue) {
      value = _internal_strvalue_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(value);
      _cached_size = sVar4 + 2 + _cached_size;
    }
    else if (VVar3 == kInt64Value) {
      value_00 = _internal_int64value(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int64Size(value_00);
      _cached_size = sVar4 + 2 + _cached_size;
    }
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    _cached_size = lVar5 + _cached_size;
  }
  size = google::protobuf::internal::ToCachedSize(_cached_size);
  SetCachedSize(this,size);
  return _cached_size;
}

Assistant:

size_t CategoricalMapping::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CategoricalMapping)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (MappingType_case()) {
    // .CoreML.Specification.StringToInt64Map stringToInt64Map = 1;
    case kStringToInt64Map: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *MappingType_.stringtoint64map_);
      break;
    }
    // .CoreML.Specification.Int64ToStringMap int64ToStringMap = 2;
    case kInt64ToStringMap: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *MappingType_.int64tostringmap_);
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  switch (ValueOnUnknown_case()) {
    // string strValue = 101;
    case kStrValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_strvalue());
      break;
    }
    // int64 int64Value = 102;
    case kInt64Value: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64Size(
          this->_internal_int64value());
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}